

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O0

pair<char_*,_char_*> __thiscall
tcmalloc::anon_unknown_0::ChunkedStorageWriter::RecycleBuffer
          (ChunkedStorageWriter *this,char *buf_begin,char *buf_end,int want_at_least)

{
  char *local_60;
  char *local_58;
  Chunk *local_50;
  Chunk *chunk;
  void *local_40;
  int local_34;
  char *pcStack_30;
  int want_at_least_local;
  char *buf_end_local;
  char *buf_begin_local;
  ChunkedStorageWriter *this_local;
  
  local_34 = want_at_least;
  pcStack_30 = buf_end;
  buf_end_local = buf_begin;
  buf_begin_local = (char *)this;
  if (this->storage_->last_chunk != (Chunk *)0x0) {
    ChunkedStorage::CloseChunk(this->storage_,(int)buf_end - (int)buf_begin);
  }
  if (local_34 == 0) {
    local_40 = (void *)0x0;
    chunk = (Chunk *)0x0;
    std::pair<char_*,_char_*>::pair<std::nullptr_t,_true>
              ((pair<char_*,_char_*> *)&this_local,&local_40,(char **)&chunk);
  }
  else {
    local_50 = ChunkedStorage::AppendChunk(this->storage_,local_34);
    local_58 = local_50->data;
    local_60 = local_50->data + local_50->size;
    std::pair<char_*,_char_*>::pair<char_*,_true>
              ((pair<char_*,_char_*> *)&this_local,&local_58,&local_60);
  }
  return _this_local;
}

Assistant:

std::pair<char*, char*> RecycleBuffer(char* buf_begin, char* buf_end, int want_at_least) override {
    if (storage_->last_chunk != nullptr) {
      storage_->CloseChunk(buf_end - buf_begin);
    }
    if (want_at_least == 0) {
      return {nullptr, 0};
    }
    auto* chunk = storage_->AppendChunk(want_at_least);
    return {chunk->data, chunk->data + chunk->size};
  }